

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getfilecontents.c
# Opt level: O1

econf_err read_file_with_callback
                    (econf_file **key_file,char *file_name,char *delim,char *comment,
                    _func__Bool_char_ptr_void_ptr *callback,void *callback_data)

{
  char cVar1;
  econf_file *ef;
  _Bool _Var2;
  int iVar3;
  econf_err eVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  econf_err t_err;
  stat sb;
  stat local_150;
  stat local_c0;
  
  if ((comment == (char *)0x0 || delim == (char *)0x0) ||
      (file_name == (char *)0x0 || key_file == (econf_file **)0x0)) {
    return ECONF_ERROR;
  }
  iVar3 = lstat(file_name,&local_c0);
  if (iVar3 == -1) {
    return ECONF_NOFILE;
  }
  if ((allow_follow_symlinks == false) && ((local_c0.st_mode & 0xf000) == 0xa000)) {
    return ECONF_ERROR_FILE_IS_SYM_LINK;
  }
  if ((file_owner_set == true) && (local_c0.st_uid != file_owner)) {
    return ECONF_WRONG_OWNER;
  }
  if ((file_group_set == true) && (local_c0.st_gid != file_group)) {
    return ECONF_WRONG_GROUP;
  }
  if (file_permissions_set != true) goto LAB_00104660;
  if ((local_c0.st_mode & file_perms_file) == 0) {
    eVar4 = ECONF_WRONG_FILE_PERMISSION;
LAB_00104656:
    bVar8 = false;
  }
  else {
    pcVar5 = strdup(file_name);
    pcVar6 = dirname(pcVar5);
    iVar3 = lstat(pcVar6,&local_150);
    free(pcVar5);
    if (iVar3 == -1) {
      eVar4 = ECONF_NOFILE;
      goto LAB_00104656;
    }
    bVar8 = (local_150.st_mode & file_perms_dir) != 0;
    eVar4 = ECONF_WRONG_DIR_PERMISSION;
  }
  if (!bVar8) {
    return eVar4;
  }
LAB_00104660:
  if ((callback != (_func__Bool_char_ptr_void_ptr *)0x0) &&
     (_Var2 = (*callback)(file_name,callback_data), !_Var2)) {
    return ECONF_PARSING_CALLBACK_FAILED;
  }
  pcVar5 = get_absolute_path(file_name,(econf_err *)&local_150);
  if (pcVar5 != (char *)0x0) {
    cVar1 = *comment;
    ef = *key_file;
    cVar7 = '#';
    if (cVar1 != '\0') {
      cVar7 = cVar1;
    }
    pcVar6 = "#";
    if (cVar1 != '\0') {
      pcVar6 = comment;
    }
    ef->comment = cVar7;
    local_150.st_dev._0_4_ = read_file(ef,pcVar5,delim,pcVar6);
    free(pcVar5);
    if ((econf_err)local_150.st_dev == ECONF_SUCCESS) {
      local_150.st_dev._0_4_ = ECONF_SUCCESS;
    }
    else {
      econf_freeFile(*key_file);
      *key_file = (econf_file *)0x0;
    }
  }
  return (econf_err)local_150.st_dev;
}

Assistant:

econf_err
read_file_with_callback(econf_file **key_file, const char *file_name,
			const char *delim, const char *comment,
			bool (*callback)(const char *filename, const void *data),
			const void *callback_data)
{
  econf_err t_err;
  struct stat sb;

  if (key_file == NULL || file_name == NULL || delim == NULL || comment == NULL)
    return ECONF_ERROR;

  // Checking file permissions, uid, group,...
  if (lstat(file_name, &sb) == -1)
    return ECONF_NOFILE;
  if (!allow_follow_symlinks && (sb.st_mode&S_IFMT) == S_IFLNK)
    return ECONF_ERROR_FILE_IS_SYM_LINK;
  if (file_owner_set && sb.st_uid != file_owner)
    return ECONF_WRONG_OWNER;
  if (file_group_set && sb.st_gid != file_group)
    return ECONF_WRONG_GROUP;
  if (file_permissions_set) {
    struct stat sb_dir;
    if (!(sb.st_mode&file_perms_file))
      return ECONF_WRONG_FILE_PERMISSION;
    char *cdirc = strdup(file_name);
    int dir_stat = lstat(dirname(cdirc), &sb_dir);
    free(cdirc);
    if ( dir_stat == -1)
      return ECONF_NOFILE;
    if (!(sb_dir.st_mode&file_perms_dir))
      return ECONF_WRONG_DIR_PERMISSION;
  }

  // calling user defined checks
  if (callback != NULL && !(*callback)(file_name, callback_data))
    return ECONF_PARSING_CALLBACK_FAILED;

  // Get absolute path if not provided
  char *absolute_path = get_absolute_path(file_name, &t_err);
  if (absolute_path == NULL)
    return t_err;

  if (*comment)
    (*key_file)->comment = comment[0];
  else {
    (*key_file)->comment = '#';
    comment = "#";
  }

  t_err = read_file(*key_file, absolute_path, delim, comment);

  free (absolute_path);

  if(t_err) {
    econf_free(*key_file);
    *key_file = NULL;
    return t_err;
  }

  return ECONF_SUCCESS;
}